

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O0

optional<DevFmtChannels> anon_unknown.dwarf_65b09::DevFmtChannelsFromEnum(ALCenum channels)

{
  uint in_ESI;
  optional<DevFmtChannels> *in_RDI;
  optional<DevFmtChannels> *in_stack_ffffffffffffff80;
  optional<DevFmtChannels> *poVar1;
  optional<DevFmtChannels> *in_stack_ffffffffffffff88;
  optional<DevFmtChannels> *in_stack_ffffffffffffff90;
  DevFmtChannels *in_stack_ffffffffffffffa8;
  optional<DevFmtChannels> local_2d;
  undefined1 local_2b;
  optional<DevFmtChannels> local_2a;
  undefined1 local_28;
  optional<DevFmtChannels> local_27;
  undefined1 local_25;
  undefined1 local_22;
  undefined1 local_1f;
  DevFmtChannels local_1e [15];
  undefined1 local_f;
  
  switch(in_ESI) {
  case 0x1500:
    local_f = 0;
    al::make_optional<DevFmtChannels>(in_stack_ffffffffffffffa8);
    al::optional<DevFmtChannels>::optional<true,_true>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    al::optional<DevFmtChannels>::~optional(in_stack_ffffffffffffff80);
    break;
  case 0x1501:
    local_1f = 1;
    al::make_optional<DevFmtChannels>(local_1e);
    al::optional<DevFmtChannels>::optional<true,_true>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    al::optional<DevFmtChannels>::~optional(in_stack_ffffffffffffff80);
    break;
  default:
    if (1 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Unsupported format channels: 0x%04x\n",(ulong)in_ESI);
    }
    al::optional<DevFmtChannels>::optional(in_RDI);
    break;
  case 0x1503:
    local_22 = 2;
    al::make_optional<DevFmtChannels>(in_stack_ffffffffffffffa8);
    al::optional<DevFmtChannels>::optional<true,_true>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    al::optional<DevFmtChannels>::~optional(in_stack_ffffffffffffff80);
    break;
  case 0x1504:
    local_25 = 3;
    al::make_optional<DevFmtChannels>(in_stack_ffffffffffffffa8);
    al::optional<DevFmtChannels>::optional<true,_true>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    al::optional<DevFmtChannels>::~optional(in_stack_ffffffffffffff80);
    break;
  case 0x1505:
    local_28 = 4;
    poVar1 = &local_27;
    al::make_optional<DevFmtChannels>(in_stack_ffffffffffffffa8);
    al::optional<DevFmtChannels>::optional<true,_true>(poVar1,in_stack_ffffffffffffff88);
    al::optional<DevFmtChannels>::~optional(in_stack_ffffffffffffff80);
    break;
  case 0x1506:
    local_2b = 5;
    poVar1 = &local_2a;
    al::make_optional<DevFmtChannels>(in_stack_ffffffffffffffa8);
    al::optional<DevFmtChannels>::optional<true,_true>(in_stack_ffffffffffffff90,poVar1);
    al::optional<DevFmtChannels>::~optional(in_stack_ffffffffffffff80);
    break;
  case 0x1507:
    poVar1 = &local_2d;
    al::make_optional<DevFmtChannels>(in_stack_ffffffffffffffa8);
    al::optional<DevFmtChannels>::optional<true,_true>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    al::optional<DevFmtChannels>::~optional(poVar1);
  }
  return SUB82(in_RDI,0);
}

Assistant:

al::optional<DevFmtChannels> DevFmtChannelsFromEnum(ALCenum channels)
{
    switch(channels)
    {
    case ALC_MONO_SOFT: return al::make_optional(DevFmtMono);
    case ALC_STEREO_SOFT: return al::make_optional(DevFmtStereo);
    case ALC_QUAD_SOFT: return al::make_optional(DevFmtQuad);
    case ALC_5POINT1_SOFT: return al::make_optional(DevFmtX51);
    case ALC_6POINT1_SOFT: return al::make_optional(DevFmtX61);
    case ALC_7POINT1_SOFT: return al::make_optional(DevFmtX71);
    case ALC_BFORMAT3D_SOFT: return al::make_optional(DevFmtAmbi3D);
    }
    WARN("Unsupported format channels: 0x%04x\n", channels);
    return al::nullopt;
}